

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

Gia_Obj_t * Gia_ObjRiToRo(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (uint)*(undefined8 *)pObj;
  if (((-1 < (int)uVar3) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) ||
     (uVar2 = (uint)((ulong)*(undefined8 *)pObj >> 0x20),
     (int)(uVar2 & 0x1fffffff) < p->vCos->nSize - p->nRegs)) {
    __assert_fail("Gia_ObjIsRi(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1f9,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (-1 < (int)uVar3) {
    __assert_fail("pObj->fTerm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"int Gia_ObjCioId(Gia_Obj_t *)");
  }
  iVar1 = p->vCis->nSize;
  uVar3 = (uVar2 & 0x1fffffff) + (iVar1 - p->vCos->nSize);
  if ((-1 < (int)uVar3) && ((int)uVar3 < iVar1)) {
    iVar1 = p->vCis->pArray[uVar3];
    if ((-1 < (long)iVar1) && (iVar1 < p->nObjs)) {
      return p->pObjs + iVar1;
    }
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline Gia_Obj_t *  Gia_ObjRiToRo( Gia_Man_t * p, Gia_Obj_t * pObj )    { assert( Gia_ObjIsRi(p, pObj) ); return Gia_ManCi(p, Gia_ManCiNum(p) - Gia_ManCoNum(p) + Gia_ObjCioId(pObj)); }